

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O0

void __thiscall juzzlin::SimpleLogger::Impl::flushEchoIfEnabled(Impl *this)

{
  mapped_type *ppbVar1;
  ostream *poVar2;
  mapped_type *stream;
  string local_30 [8];
  key_type *in_stack_ffffffffffffffd8;
  map<juzzlin::SimpleLogger::Level,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::less<juzzlin::SimpleLogger::Level>,_std::allocator<std::pair<const_juzzlin::SimpleLogger::Level,_std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
  *in_stack_ffffffffffffffe0;
  
  if (((m_echoMode & 1) != 0) &&
     (ppbVar1 = std::
                map<juzzlin::SimpleLogger::Level,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::less<juzzlin::SimpleLogger::Level>,_std::allocator<std::pair<const_juzzlin::SimpleLogger::Level,_std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                ::operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8),
     *ppbVar1 != (mapped_type)0x0)) {
    poVar2 = *ppbVar1;
    std::__cxx11::ostringstream::str();
    poVar2 = std::operator<<(poVar2,local_30);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_30);
    std::ostream::flush();
  }
  return;
}

Assistant:

void SimpleLogger::Impl::flushEchoIfEnabled()
{
    if (m_echoMode) {
        if (auto && stream = m_streams[m_activeLevel]; stream) {
            *stream << m_message.str() << std::endl;
            stream->flush();
        }
    }
}